

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

ON_wString __thiscall ON_wString::Duplicate(ON_wString *this)

{
  ON_Internal_Empty_wString *pOVar1;
  ON_wString *in_RSI;
  
  pOVar1 = &empty_wstring;
  if (in_RSI->m_s != (wchar_t *)0x0) {
    pOVar1 = (ON_Internal_Empty_wString *)(in_RSI->m_s + -3);
  }
  if ((pOVar1->header).string_length < 1) {
    ON_wString(this,&EmptyString);
  }
  else {
    ON_wString(this,in_RSI);
    CopyArray(this);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::Duplicate() const
{
  if (Length() <= 0)
    return ON_wString::EmptyString;
  ON_wString s = *this;
  s.CopyArray();
  return s;
}